

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,int type)

{
  xmlHashTablePtr table;
  void *pvVar1;
  
  table = ctxt->attsSpecial;
  if (table == (xmlHashTablePtr)0x0) {
    table = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsSpecial = table;
    if (table == (xmlHashTablePtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return;
    }
  }
  pvVar1 = xmlHashLookup2(table,fullname,fullattr);
  if (pvVar1 != (void *)0x0) {
    return;
  }
  xmlHashAddEntry2(ctxt->attsSpecial,fullname,fullattr,(void *)(ulong)(uint)type);
  return;
}

Assistant:

static void
xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,
		  const xmlChar *fullname,
		  const xmlChar *fullattr,
		  int type)
{
    if (ctxt->attsSpecial == NULL) {
        ctxt->attsSpecial = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsSpecial == NULL)
	    goto mem_error;
    }

    if (xmlHashLookup2(ctxt->attsSpecial, fullname, fullattr) != NULL)
        return;

    xmlHashAddEntry2(ctxt->attsSpecial, fullname, fullattr,
                     (void *) (ptrdiff_t) type);
    return;

mem_error:
    xmlErrMemory(ctxt, NULL);
    return;
}